

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  JBLOCKROW paJVar4;
  jpeg_component_info *pjVar5;
  bool bVar6;
  undefined4 uVar7;
  ushort uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var14;
  long lVar15;
  _func_void_j_compress_ptr *p_Var16;
  uint uVar17;
  long lVar18;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar11 = *(uint *)&pjVar3[4].start_pass;
    if (uVar11 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      uVar11 = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar3[4].start_pass = uVar11 - 1;
  }
  lVar9 = 0;
  do {
    if (cinfo->blocks_in_MCU <= lVar9) {
      return 1;
    }
    paJVar4 = MCU_data[lVar9];
    lVar15 = (long)cinfo->MCU_membership[lVar9];
    pjVar5 = cinfo->cur_comp_info[lVar15];
    iVar2 = pjVar5->dc_tbl_no;
    p_Var14 = (&pjVar3[4].encode_mcu)[iVar2] + *(int *)((long)&pjVar3[3].encode_mcu + lVar15 * 4);
    iVar12 = (int)(*paJVar4)[0] - *(int *)((long)&pjVar3[2].finish_pass + lVar15 * 4);
    if (iVar12 == 0) {
      arith_encode(cinfo,(uchar *)p_Var14,0);
      *(undefined4 *)((long)&pjVar3[3].encode_mcu + lVar15 * 4) = 0;
    }
    else {
      *(int *)((long)&pjVar3[2].finish_pass + lVar15 * 4) = (int)(*paJVar4)[0];
      arith_encode(cinfo,(uchar *)p_Var14,1);
      uVar11 = 0;
      bVar6 = iVar12 < 1;
      if (bVar6) {
        iVar12 = -iVar12;
        lVar18 = 3;
        uVar7 = 8;
      }
      else {
        lVar18 = 2;
        uVar7 = 4;
      }
      arith_encode(cinfo,(uchar *)(p_Var14 + 1),(uint)bVar6);
      p_Var14 = p_Var14 + lVar18;
      *(undefined4 *)((long)&pjVar3[3].encode_mcu + lVar15 * 4) = uVar7;
      uVar13 = iVar12 - 1;
      if (uVar13 != 0) {
        uVar11 = 1;
        arith_encode(cinfo,(uchar *)p_Var14,1);
        p_Var14 = (&pjVar3[4].encode_mcu)[iVar2] + 0x14;
        for (uVar17 = uVar13; 1 < uVar17; uVar17 = uVar17 >> 1) {
          arith_encode(cinfo,(uchar *)p_Var14,1);
          uVar11 = uVar11 * 2;
          p_Var14 = p_Var14 + 1;
        }
      }
      iVar12 = 0;
      arith_encode(cinfo,(uchar *)p_Var14,0);
      if ((int)uVar11 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar2] & 0x3f)) >> 1)) {
LAB_001270db:
        *(int *)((long)&pjVar3[3].encode_mcu + lVar15 * 4) = iVar12;
      }
      else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar2] & 0x3f)) >> 1) < (int)uVar11) {
        iVar12 = *(int *)((long)&pjVar3[3].encode_mcu + lVar15 * 4) + 8;
        goto LAB_001270db;
      }
      while (1 < uVar11) {
        uVar11 = (int)uVar11 >> 1;
        arith_encode(cinfo,(uchar *)(p_Var14 + 0xe),(uint)((uVar11 & uVar13) != 0));
      }
    }
    iVar2 = pjVar5->ac_tbl_no;
    uVar11 = 0x3f;
    do {
      uVar13 = uVar11;
      if (uVar13 == 0) break;
      uVar11 = uVar13 - 1;
    } while ((*paJVar4)[jpeg_natural_order[uVar13]] == 0);
    iVar12 = 1;
    while (iVar12 <= (int)uVar13) {
      p_Var16 = (&pjVar3[9].finish_pass)[iVar2];
      lVar15 = (long)(iVar12 * 3 + -3);
      arith_encode(cinfo,(uchar *)(p_Var16 + lVar15),0);
      lVar18 = (long)iVar12;
      p_Var16 = p_Var16 + lVar15 + 2;
      while( true ) {
        iVar12 = iVar12 + 1;
        uVar1 = (*paJVar4)[jpeg_natural_order[lVar18]];
        if (uVar1 != 0) break;
        arith_encode(cinfo,(uchar *)(p_Var16 + -1),0);
        lVar18 = lVar18 + 1;
        p_Var16 = p_Var16 + 3;
      }
      arith_encode(cinfo,(uchar *)(p_Var16 + -1),1);
      uVar8 = -uVar1;
      if (0 < (short)uVar1) {
        uVar8 = uVar1;
      }
      arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),(uint)((short)uVar1 < 1));
      uVar11 = uVar8 - 1;
      if (uVar11 == 0) {
        uVar17 = 0;
      }
      else {
        arith_encode(cinfo,(uchar *)p_Var16,1);
        if (uVar11 == 1) {
          uVar17 = 1;
        }
        else {
          arith_encode(cinfo,(uchar *)p_Var16,1);
          lVar15 = 0xbd;
          if ((long)(ulong)cinfo->arith_ac_K[iVar2] < lVar18) {
            lVar15 = 0xd9;
          }
          p_Var16 = (&pjVar3[9].finish_pass)[iVar2] + lVar15;
          uVar17 = 2;
          uVar10 = uVar11;
          while (uVar10 = (int)uVar10 >> 1, 1 < uVar10) {
            arith_encode(cinfo,(uchar *)p_Var16,1);
            uVar17 = uVar17 * 2;
            p_Var16 = p_Var16 + 1;
          }
        }
      }
      arith_encode(cinfo,(uchar *)p_Var16,0);
      while (1 < uVar17) {
        uVar17 = (int)uVar17 >> 1;
        arith_encode(cinfo,(uchar *)(p_Var16 + 0xe),(uint)((uVar17 & uVar11) != 0));
      }
    }
    if (iVar12 < 0x40) {
      arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + (iVar12 * 3 + -3)),1);
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
encode_mcu(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;      /* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, st + 1, 0); /* Table F.4: SS = S0 + 1 */
        st += 2;                        /* Table F.4: SP = S0 + 2 */
        entropy->dc_context[ci] = 4;    /* small positive diff category */
      } else {
        v = -v;
        arith_encode(cinfo, st + 1, 1); /* Table F.4: SS = S0 + 1 */
        st += 3;                        /* Table F.4: SN = S0 + 3 */
        entropy->dc_context[ci] = 8;    /* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;    /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] += 8;   /* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    for (ke = DCTSIZE2 - 1; ke > 0; ke--)
      if ((*block)[jpeg_natural_order[ke]]) break;

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 1; k <= ke; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 0);       /* EOB decision */
      while ((v = (*block)[jpeg_natural_order[k]]) == 0) {
        arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
        v = -v;
        arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        if (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (v2 >>= 1) {
            arith_encode(cinfo, st, 1);
            m <<= 1;
            st += 1;
          }
        }
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k <= DCTSIZE2 - 1 */
    if (k <= DCTSIZE2 - 1) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}